

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O0

int get_av1config_from_obu(uint8_t *buffer,size_t length,int is_annexb,Av1Config *config)

{
  aom_codec_err_t aVar1;
  undefined1 *in_RCX;
  long in_RSI;
  size_t *in_RDI;
  size_t obu_header_length;
  size_t sequence_header_length;
  ObuHeader obu_header;
  Av1Config *in_stack_00000098;
  size_t in_stack_000000a0;
  uint8_t *in_stack_000000a8;
  undefined1 local_48 [8];
  char local_40;
  undefined1 *local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (((in_RDI == (size_t *)0x0) || (in_RSI == 0)) || (in_RCX == (undefined1 *)0x0)) {
    iVar2 = -1;
  }
  else {
    local_28 = in_RCX;
    memset(local_48,0,0x20);
    aVar1 = aom_read_obu_header_and_size
                      ((uint8_t *)obu_header._8_8_,obu_header.size,sequence_header_length._4_4_,
                       (ObuHeader *)obu_header_length,
                       (size_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI);
    if ((aVar1 == AOM_CODEC_OK) && (local_40 == '\x01')) {
      memset(local_28,0,0xd);
      *local_28 = 1;
      local_28[1] = 1;
      iVar2 = parse_sequence_header(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
    }
    else {
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int get_av1config_from_obu(const uint8_t *buffer, size_t length, int is_annexb,
                           Av1Config *config) {
  if (!buffer || length == 0 || !config) {
    return -1;
  }

  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));

  size_t sequence_header_length = 0;
  size_t obu_header_length = 0;
  if (aom_read_obu_header_and_size(buffer, length, is_annexb, &obu_header,
                                   &sequence_header_length,
                                   &obu_header_length) != AOM_CODEC_OK ||
      obu_header.type != OBU_SEQUENCE_HEADER ||
      sequence_header_length + obu_header_length > length) {
    return -1;
  }

  memset(config, 0, sizeof(*config));
  config->marker = 1;
  config->version = 1;
  return parse_sequence_header(buffer + obu_header_length,
                               sequence_header_length, config);
}